

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Statement * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,IfStatement *i)

{
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  IfStatement *pIVar4;
  Constant *pCVar5;
  pool_ptr<soul::AST::Constant> constant;
  pool_ptr<soul::AST::Constant> local_58;
  CompileMessage local_50;
  
  if (i->isConstIf == true) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&i->condition);
  }
  else {
    pIVar4 = (IfStatement *)
             ErrorIgnoringRewritingASTVisitor::visit
                       (&this->super_ErrorIgnoringRewritingASTVisitor,i);
    if (pIVar4 != i) {
      throwInternalCompilerError("std::addressof (result) == std::addressof (i)","visit",0x694);
    }
  }
  (*(((i->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_58);
  if (local_58.object == (Constant *)0x0) {
    if (i->isConstIf == true) {
      if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
        pEVar2 = (i->condition).object;
        Errors::expectedConstant<>();
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false)
        ;
      }
      psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
      *psVar1 = *psVar1 + 1;
    }
  }
  else {
    pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_58);
    bVar3 = soul::Value::getAsBool(&pCVar5->value);
    if (bVar3) {
      RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->trueBranch);
      i = (IfStatement *)(i->trueBranch).object;
    }
    else if ((i->falseBranch).object == (Statement *)0x0) {
      i = (IfStatement *)
          PoolAllocator::allocate<soul::AST::NoopStatement,soul::AST::Context&>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                     &(i->super_Statement).super_ASTObject.context);
    }
    else {
      RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->falseBranch);
      i = (IfStatement *)pool_ptr<soul::AST::Statement>::operator*(&i->falseBranch);
    }
  }
  return &i->super_Statement;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);
            }
            else
            {
                auto& result = super::visit (i);
                SOUL_ASSERT (std::addressof (result) == std::addressof (i));
            }

            if (auto constant = i.condition->getAsConstant())
            {
                if (constant->value.getAsBool())
                {
                    replaceStatement (i.trueBranch);
                    return i.trueBranch;
                }

                if (i.falseBranch != nullptr)
                {
                    replaceStatement (i.falseBranch);
                    return *i.falseBranch;
                }

                return allocator.allocate<AST::NoopStatement> (i.context);
            }

            if (i.isConstIf)
            {
                if (! ignoreErrors)
                    i.condition->context.throwError (Errors::expectedConstant());
                else
                    ++numFails;
            }

            return i;
        }